

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

int log_level(char *name,char *level,size_t length)

{
  log_level_id level_00;
  log_impl impl_00;
  log_impl impl;
  log_level_id id;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_4;
  
  level_00 = log_level_to_enum((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
                               ,(size_t)in_stack_ffffffffffffffd0);
  if (level_00 < LOG_LEVEL_SIZE) {
    impl_00 = log_singleton_get(in_stack_ffffffffffffffd0);
    if (impl_00 != (log_impl)0x0) {
      log_impl_verbosity(impl_00,level_00);
    }
    local_4 = 0;
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int log_level(const char *name, const char *level, size_t length)
{
	enum log_level_id id = log_level_to_enum(level, length);

	if (id < LOG_LEVEL_SIZE)
	{
		log_impl impl = log_singleton_get(name);

		if (impl != NULL)
		{
			log_impl_verbosity(impl, id);
		}

		return 0;
	}

	return 1;
}